

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyGC.cpp
# Opt level: O0

void __thiscall TinyGC::Mark(TinyGC *this)

{
  bool bVar1;
  ostream *poVar2;
  _Node_iterator_base<GarbageCollectedBase_*,_false> local_80;
  _Node_iterator_base<GarbageCollectedBase_*,_false> local_78;
  GarbageCollectedBase *local_70;
  GarbageCollectedBase *ptr;
  intptr_t **end;
  intptr_t **start;
  ThreadState *ts;
  pair<const_std::thread::id,_TinyGC::ThreadState_*> *ts_;
  iterator __end1;
  iterator __begin1;
  unordered_map<std::thread::id,_TinyGC::ThreadState_*,_std::hash<std::thread::id>,_std::equal_to<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_TinyGC::ThreadState_*>_>_>
  *__range1;
  undefined1 local_20 [8];
  unique_lock<std::mutex> lck;
  TinyGC *this_local;
  
  lck._8_8_ = this;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_20,&this->ts_mxt_);
  poVar2 = std::operator<<((ostream *)&std::cerr,"\nMark Start~");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  SetGCPhase(this,kMarking);
  Visitor::SetMark(this->visitor_,true);
  __end1 = std::
           unordered_map<std::thread::id,_TinyGC::ThreadState_*,_std::hash<std::thread::id>,_std::equal_to<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_TinyGC::ThreadState_*>_>_>
           ::begin(&this->thread_to_stack_);
  ts_ = (pair<const_std::thread::id,_TinyGC::ThreadState_*> *)
        std::
        unordered_map<std::thread::id,_TinyGC::ThreadState_*,_std::hash<std::thread::id>,_std::equal_to<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_TinyGC::ThreadState_*>_>_>
        ::end(&this->thread_to_stack_);
  while (bVar1 = std::__detail::operator!=
                           (&__end1.
                             super__Node_iterator_base<std::pair<const_std::thread::id,_TinyGC::ThreadState_*>,_false>
                            ,(_Node_iterator_base<std::pair<const_std::thread::id,_TinyGC::ThreadState_*>,_false>
                              *)&ts_), bVar1) {
    ts = (ThreadState *)
         std::__detail::
         _Node_iterator<std::pair<const_std::thread::id,_TinyGC::ThreadState_*>,_false,_false>::
         operator*(&__end1);
    start = (intptr_t **)ts->stack_end_;
    ThreadState::GetCurrentStackPosition((ThreadState *)start);
    end = (intptr_t **)ThreadState::GetStackEndAddr((ThreadState *)start);
    ptr = (GarbageCollectedBase *)ThreadState::GetStackStartAddr((ThreadState *)start);
    for (; end < ptr; end = end + 1) {
      if (&Elf64_Ehdr_00100000 < (Elf64_Ehdr *)*end) {
        local_70 = (GarbageCollectedBase *)*end;
        local_78._M_cur =
             (__node_type *)
             std::
             unordered_set<GarbageCollectedBase_*,_std::hash<GarbageCollectedBase_*>,_std::equal_to<GarbageCollectedBase_*>,_std::allocator<GarbageCollectedBase_*>_>
             ::find(&this->objs_addr_,&local_70);
        local_80._M_cur =
             (__node_type *)
             std::
             unordered_set<GarbageCollectedBase_*,_std::hash<GarbageCollectedBase_*>,_std::equal_to<GarbageCollectedBase_*>,_std::allocator<GarbageCollectedBase_*>_>
             ::end(&this->objs_addr_);
        bVar1 = std::__detail::operator!=(&local_78,&local_80);
        if (bVar1) {
          Visitor::ObjTrace(this->visitor_,local_70);
          poVar2 = std::operator<<((ostream *)&std::cerr,"find object at ");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::hex);
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_70);
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        }
      }
    }
    std::__detail::
    _Node_iterator<std::pair<const_std::thread::id,_TinyGC::ThreadState_*>,_false,_false>::
    operator++(&__end1);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_20);
  return;
}

Assistant:

void TinyGC::Mark() {
  std::unique_lock<std::mutex> lck(ts_mxt_);
  LOG("\nMark Start~");
  SetGCPhase(GCPhase::kMarking);
  visitor_->SetMark(true);

  for (auto &ts_ : thread_to_stack_) {
    ThreadState *ts = ts_.second;
    ts->GetCurrentStackPosition();
    intptr_t **start = reinterpret_cast<intptr_t **>(ts->GetStackEndAddr());
    intptr_t **end = reinterpret_cast<intptr_t **>(ts->GetStackStartAddr());
    for (; start < end; start++) {
      if (*start > (intptr_t *)0x100000) {
        GarbageCollectedBase *ptr =
            reinterpret_cast<GarbageCollectedBase *>(*start);
        if (objs_addr_.find(ptr) != objs_addr_.end()) {
          visitor_->ObjTrace((GarbageCollectedBase *)ptr);
          LOG("find object at " << std::hex << ptr);
        }
      }
    }
  }
}